

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O0

void slang::ast::SemanticFacts::populateTimeScale
               (TimeScale *timeScale,Scope *scope,TimeUnitsDeclarationSyntax *syntax,
               optional<slang::SourceRange> *unitsRange,optional<slang::SourceRange> *precisionRange
               ,bool isFirst)

{
  long lVar1;
  SourceRange range;
  Token token;
  Token token_00;
  Token token_01;
  bool bVar2;
  SourceLocation SVar3;
  SourceRange *pSVar4;
  TimeScaleValue *in_RCX;
  optional<slang::SourceRange> *in_RDX;
  Diagnostic *in_RSI;
  undefined8 in_RDI;
  byte in_R9B;
  Info *unaff_retaddr;
  Diagnostic *diag;
  Scope *in_stack_00000078;
  anon_class_24_3_c5d18a8a handle;
  bool errored;
  TimeScaleValue *in_stack_ffffffffffffff60;
  TimeScaleValue *in_stack_ffffffffffffff68;
  __unspec local_7a;
  type_conflict local_79;
  SourceLocation local_78;
  SourceLocation local_70;
  undefined8 local_68;
  undefined8 local_60;
  SourceLocation local_58;
  SourceLocation local_50;
  byte *local_40;
  byte *local_38;
  byte local_2a;
  byte local_29 [9];
  
  local_29[0] = in_R9B & 1;
  local_2a = 0;
  local_40 = &local_2a;
  local_38 = local_29;
  if (*(short *)((long)&in_RDX[3].super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::SourceRange>._M_payload + 8) == 0x12e) {
    local_58 = in_RDX[4].super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
    local_50 = in_RDX[4].super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
    token.info = unaff_retaddr;
    token._0_8_ = in_RDI;
    populateTimeScale::anon_class_24_3_c5d18a8a::operator()
              ((anon_class_24_3_c5d18a8a *)in_RSI,token,in_RDX,in_RCX);
    if (*(long *)&in_RDX[4].super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::SourceRange>._M_engaged != 0) {
      lVar1 = *(long *)&in_RDX[4].super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::SourceRange>._M_engaged;
      local_68 = *(undefined8 *)(lVar1 + 0x28);
      local_60 = *(undefined8 *)(lVar1 + 0x30);
      token_00.info = unaff_retaddr;
      token_00.kind = (short)in_RDI;
      token_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
      token_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
      token_00.rawLen = (int)((ulong)in_RDI >> 0x20);
      populateTimeScale::anon_class_24_3_c5d18a8a::operator()
                ((anon_class_24_3_c5d18a8a *)in_RSI,token_00,in_RDX,in_RCX);
    }
  }
  else {
    local_78 = in_RDX[4].super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
    local_70 = in_RDX[4].super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
    token_01.info = unaff_retaddr;
    token_01._0_8_ = in_RDI;
    populateTimeScale::anon_class_24_3_c5d18a8a::operator()
              ((anon_class_24_3_c5d18a8a *)in_RSI,token_01,in_RDX,in_RCX);
  }
  if ((((local_2a & 1) == 0) &&
      (bVar2 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x770b82), bVar2
      )) && (bVar2 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x770b98),
            bVar2)) {
    local_79 = (type_conflict)
               TimeScaleValue::operator<=>(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cmp_cat::__unspec::__unspec(&local_7a,(__unspec *)0x0);
    bVar2 = std::operator>(local_79);
    if (bVar2) {
      std::optional<slang::SourceRange>::operator*((optional<slang::SourceRange> *)0x770c03);
      SVar3 = (SourceLocation)
              Scope::addDiag(in_stack_00000078,handle.isFirst._4_4_,(SourceRange)handle._0_16_);
      pSVar4 = std::optional<slang::SourceRange>::operator*
                         ((optional<slang::SourceRange> *)0x770c48);
      range.endLoc = pSVar4->startLoc;
      range.startLoc = SVar3;
      Diagnostic::operator<<(in_RSI,range);
    }
  }
  return;
}

Assistant:

void SemanticFacts::populateTimeScale(TimeScale& timeScale, const Scope& scope,
                                      const TimeUnitsDeclarationSyntax& syntax,
                                      std::optional<SourceRange>& unitsRange,
                                      std::optional<SourceRange>& precisionRange, bool isFirst) {
    bool errored = false;
    auto handle = [&](Token token, std::optional<SourceRange>& prevRange, TimeScaleValue& value) {
        // If there were syntax errors just bail out, diagnostics have already been issued.
        if (token.isMissing() || token.kind != TokenKind::TimeLiteral)
            return;

        auto val = TimeScaleValue::fromLiteral(token.realValue(), token.numericFlags().unit());
        if (!val) {
            scope.addDiag(diag::InvalidTimeScaleSpecifier, token.location());
            return;
        }

        if (prevRange) {
            // If the value was previously set, we need to make sure this new
            // value is exactly the same, otherwise we error.
            if (value != *val && !errored) {
                auto& diag = scope.addDiag(diag::MismatchedTimeScales, token.range());
                diag.addNote(diag::NotePreviousDefinition, *prevRange);
                errored = true;
            }
        }
        else {
            // The first time scale declarations must be the first elements in the parent scope.
            if (!isFirst && !errored) {
                scope.addDiag(diag::TimeScaleFirstInScope, token.range());
                errored = true;
            }

            value = *val;
            prevRange = token.range();
        }
    };

    if (syntax.keyword.kind == TokenKind::TimeUnitKeyword) {
        handle(syntax.time, unitsRange, timeScale.base);
        if (syntax.divider)
            handle(syntax.divider->value, precisionRange, timeScale.precision);
    }
    else {
        handle(syntax.time, precisionRange, timeScale.precision);
    }

    if (!errored && unitsRange && precisionRange && timeScale.precision > timeScale.base) {
        auto& diag = scope.addDiag(diag::InvalidTimeScalePrecision, *precisionRange);
        diag << *unitsRange;
    }
}